

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_is_first_lane_masked(Impl *this,SPIRVModule *module)

{
  initializer_list<unsigned_int> __l;
  Id IVar1;
  Function *pFVar2;
  Block *this_00;
  Block *this_01;
  Block *this_02;
  pointer pIVar3;
  size_t sVar4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_d8;
  undefined4 local_d0;
  Id local_cc;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_c8;
  __single_object phi;
  Id local_b4;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_b0;
  __single_object elect;
  Id elect_id;
  Block *merge_block;
  Block *is_active_block;
  Block *is_helper_block;
  allocator_type local_6d;
  Id local_6c;
  iterator local_68;
  undefined8 local_60;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_58;
  Function *local_40;
  Function *func;
  Block *current_build_point;
  Block *pBStack_28;
  Id bool_type;
  Block *entry;
  SPIRVModule *module_local;
  Impl *this_local;
  
  if (this->wave_is_first_lane_masked_id == 0) {
    pBStack_28 = (Block *)0x0;
    entry = (Block *)module;
    module_local = (SPIRVModule *)this;
    current_build_point._4_4_ = spv::Builder::makeBoolType(&this->builder);
    func = (Function *)spv::Builder::getBuildPoint(&this->builder);
    spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
    IVar1 = current_build_point._4_4_;
    local_6c = current_build_point._4_4_;
    local_68 = &local_6c;
    local_60 = 1;
    __l._M_len = 1;
    __l._M_array = local_68;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
              (&local_58,__l,&local_6d);
    memset(&is_helper_block,0,0x18);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              *)&is_helper_block);
    sVar4 = 0x7fffffff;
    pFVar2 = spv::Builder::makeFunctionEntry
                       (&this->builder,DecorationMax,IVar1,"WaveIsFirstLane",&local_58,
                        (Vector<dxil_spv::Vector<Decoration>_> *)&is_helper_block,
                        &stack0xffffffffffffffd8);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               *)&is_helper_block);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_58);
    local_40 = pFVar2;
    this_00 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    sVar4 = (size_t)IVar1;
    spv::Block::Block(this_00,IVar1,local_40);
    this_01 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    sVar4 = (size_t)IVar1;
    spv::Block::Block(this_01,IVar1,local_40);
    this_02 = (Block *)spv::Block::operator_new((Block *)0x78,sVar4);
    IVar1 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block(this_02,IVar1,local_40);
    spv::Builder::setBuildPoint(&this->builder,pBStack_28);
    spv::Builder::createSelectionMerge(&this->builder,this_02,0);
    IVar1 = spv::Function::getParamId(local_40,0);
    spv::Builder::createConditionalBranch(&this->builder,IVar1,this_00,this_01);
    spv::Builder::setBuildPoint(&this->builder,this_00);
    spv::Builder::createBranch(&this->builder,this_02);
    spv::Builder::setBuildPoint(&this->builder,this_01);
    local_b4 = spv::Builder::getUniqueId(&this->builder);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_b0,&local_b4,(Op *)((long)&current_build_point + 4));
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b0);
    IVar1 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_b0);
    elect._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Instruction::getResultId(pIVar3);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&phi,&local_b0);
    add_instruction(this,this_01,&phi);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&phi);
    spv::Builder::createBranch(&this->builder,this_02);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_b0);
    spv::Builder::setBuildPoint(&this->builder,this_02);
    local_cc = spv::Builder::getUniqueId(&this->builder);
    local_d0 = 0xf5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_c8,&local_cc,(Op *)((long)&current_build_point + 4));
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    spv::Instruction::addIdOperand
              (pIVar3,elect._M_t.
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    IVar1 = spv::Block::getId(this_01);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    IVar1 = spv::Builder::makeBoolConstant(&this->builder,false,false);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    IVar1 = spv::Block::getId(this_00);
    spv::Instruction::addIdOperand(pIVar3,IVar1);
    pIVar3 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_c8);
    elect._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Instruction::getResultId(pIVar3);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_d8,&local_c8);
    add_instruction(this,this_02,&local_d8);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_d8);
    spv::Builder::makeReturn
              (&this->builder,false,
               elect._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_);
    spv::Builder::setBuildPoint(&this->builder,(Block *)func);
    IVar1 = spv::Function::getId(local_40);
    this->wave_is_first_lane_masked_id = IVar1;
    this_local._4_4_ = this->wave_is_first_lane_masked_id;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_c8);
  }
  else {
    this_local._4_4_ = this->wave_is_first_lane_masked_id;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_is_first_lane_masked(SPIRVModule &module)
{
	if (wave_is_first_lane_masked_id)
		return wave_is_first_lane_masked_id;

	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();

	auto *current_build_point = builder.getBuildPoint();
	builder.addCapability(spv::CapabilityGroupNonUniform);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, bool_type,
	                                       "WaveIsFirstLane",
	                                       { bool_type }, {}, &entry);

	auto *is_helper_block = new spv::Block(builder.getUniqueId(), *func);
	auto *is_active_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	spv::Id elect_id;

	builder.setBuildPoint(entry);

	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(func->getParamId(0), is_helper_block, is_active_block);

	{
		builder.setBuildPoint(is_helper_block);
		builder.createBranch(merge_block);
	}

	{
		builder.setBuildPoint(is_active_block);
		auto elect = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
		elect->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		elect_id = elect->getResultId();
		add_instruction(is_active_block, std::move(elect));
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpPhi);
	phi->addIdOperand(elect_id);
	phi->addIdOperand(is_active_block->getId());
	phi->addIdOperand(builder.makeBoolConstant(false));
	phi->addIdOperand(is_helper_block->getId());
	elect_id = phi->getResultId();
	add_instruction(merge_block, std::move(phi));

	builder.makeReturn(false, elect_id);
	builder.setBuildPoint(current_build_point);
	wave_is_first_lane_masked_id = func->getId();
	return wave_is_first_lane_masked_id;
}